

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O1

UniValue * JSON(UniValue *__return_storage_ptr__,string_view json)

{
  ssize_t sVar1;
  undefined1 **line_num;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar2;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  lazy_ostream local_88;
  undefined1 *local_78;
  char **local_70;
  assertion_result local_68;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val)._M_string_length = 0;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->typ = VNULL;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_38 = "";
  line_num = &local_50;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x19;
  file.m_begin = (iterator)&local_40;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)line_num,msg);
  sVar1 = UniValue::read(__return_storage_ptr__,(int)json._M_len,json._M_str,(size_t)line_num);
  local_68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB81(sVar1,0);
  local_68.m_message.px = (element_type *)0x0;
  local_68.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70 = &local_98;
  local_98 = "value.read(json)";
  local_90 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_68,&local_88,1,0,WARN,_cVar2,(size_t)&local_a8,0x19);
  boost::detail::shared_count::~shared_count(&local_68.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static UniValue JSON(std::string_view json)
{
    UniValue value;
    BOOST_CHECK(value.read(json));
    return value;
}